

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

iterator cmList::Insert(container_type *container,const_iterator pos,string *value,
                       ExpandElements expandElements,EmptyElements emptyElements)

{
  char *pcVar1;
  char cVar2;
  pointer pbVar3;
  long lVar4;
  iterator iVar5;
  pointer pbVar6;
  const_iterator __position;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last_00;
  int iVar7;
  string newValue;
  
  pbVar3 = (container->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (expandElements == Yes) {
    if ((emptyElements == No) && (value->_M_string_length == 0)) {
      return (iterator)pos._M_current;
    }
    iVar7 = 0;
    lVar4 = std::__cxx11::string::find((char)value,0x3b);
    if (lVar4 == -1) {
LAB_0026fb31:
      iVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_insert_rval(container,pos,value);
      return (iterator)iVar5._M_current;
    }
    newValue._M_dataplus._M_p = (pointer)&newValue.field_2;
    newValue._M_string_length = 0;
    newValue.field_2._M_local_buf[0] = '\0';
    __first._M_current = (value->_M_dataplus)._M_p;
    __last._M_current = __first._M_current + value->_M_string_length;
    __position._M_current = pos._M_current;
    for (__last_00._M_current = __first._M_current; __last_00._M_current != __last._M_current;
        __last_00._M_current = __last_00._M_current + 1) {
      cVar2 = *__last_00._M_current;
      if (cVar2 == ';') {
        if (iVar7 == 0) {
          std::__cxx11::string::
          append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                    ((string *)&newValue,__first,__last_00);
          __first._M_current = __last_00._M_current + 1;
          iVar7 = 0;
          if ((emptyElements == Yes) || (newValue._M_string_length != 0)) {
            iVar5 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert(container,__position,&newValue);
            newValue._M_string_length = 0;
            __position._M_current = iVar5._M_current + 1;
            *newValue._M_dataplus._M_p = '\0';
          }
        }
      }
      else if (cVar2 == '[') {
        iVar7 = iVar7 + 1;
      }
      else if (cVar2 == ']') {
        iVar7 = iVar7 + -1;
      }
      else if (((cVar2 == '\\') && (pcVar1 = __last_00._M_current + 1, pcVar1 != __last._M_current))
              && (*pcVar1 == ';')) {
        std::__cxx11::string::append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  ((string *)&newValue,__first,__last_00);
        __first._M_current = pcVar1;
        __last_00._M_current = pcVar1;
      }
    }
    std::__cxx11::string::append<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((string *)&newValue,__first,__last);
    if ((emptyElements == Yes) || (newValue._M_string_length != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(container,__position,&newValue);
    }
    std::__cxx11::string::~string((string *)&newValue);
    pbVar6 = (container->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  else if ((emptyElements == Yes) || (pbVar6 = pbVar3, value->_M_string_length != 0))
  goto LAB_0026fb31;
  return (iterator)(pos._M_current + ((long)pbVar6 - (long)pbVar3));
}

Assistant:

cmList::container_type::iterator cmList::Insert(
  container_type& container, container_type::const_iterator pos,
  std::string&& value, ExpandElements expandElements,
  EmptyElements emptyElements)
{
  auto delta = std::distance(container.cbegin(), pos);
  auto insertPos = container.begin() + delta;

  if (expandElements == ExpandElements::Yes) {
    // If argument is empty, it is an empty list.
    if (emptyElements == EmptyElements::No && value.empty()) {
      return insertPos;
    }

    // if there are no ; in the name then just copy the current string
    if (value.find(';') == std::string::npos) {
      return container.insert(insertPos, std::move(value));
    }

    std::string newValue;
    // Break the string at non-escaped semicolons not nested in [].
    int squareNesting = 0;
    auto last = value.begin();
    auto const cend = value.end();
    for (auto c = last; c != cend; ++c) {
      switch (*c) {
        case '\\': {
          // We only want to allow escaping of semicolons.  Other
          // escapes should not be processed here.
          auto cnext = c + 1;
          if ((cnext != cend) && *cnext == ';') {
            newValue.append(last, c);
            // Skip over the escape character
            last = cnext;
            c = cnext;
          }
        } break;
        case '[': {
          ++squareNesting;
        } break;
        case ']': {
          --squareNesting;
        } break;
        case ';': {
          // brackets.
          if (squareNesting == 0) {
            newValue.append(last, c);
            // Skip over the semicolon
            last = c + 1;
            if (!newValue.empty() || emptyElements == EmptyElements::Yes) {
              // Add the last argument.
              insertPos = container.insert(insertPos, newValue);
              insertPos++;
              newValue.clear();
            }
          }
        } break;
        default: {
          // Just append this character.
        } break;
      }
    }
    newValue.append(last, cend);
    if (!newValue.empty() || emptyElements == EmptyElements::Yes) {
      // Add the last argument.
      container.insert(insertPos, std::move(newValue));
    }
  } else if (!value.empty() || emptyElements == EmptyElements::Yes) {
    return container.insert(insertPos, std::move(value));
  }
  return container.begin() + delta;
}